

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O3

wchar_t bid_keycmp(char *p,char *key,ssize_t len)

{
  wchar_t wVar1;
  ulong uVar2;
  char *pcVar3;
  byte *pbVar4;
  long lVar5;
  byte bVar6;
  
  wVar1 = L'\0';
  if (len < 1) {
    len = 0;
    pcVar3 = key;
    pbVar4 = (byte *)p;
  }
  else {
    pbVar4 = (byte *)(p + len);
    pcVar3 = key + len;
    lVar5 = len + 1;
    uVar2 = 0;
    do {
      bVar6 = p[uVar2];
      if (bVar6 == 0) {
        len = uVar2 & 0xffffffff;
        pcVar3 = key + uVar2;
        pbVar4 = (byte *)(p + uVar2);
        break;
      }
      if (key[uVar2] == 0) {
        pbVar4 = (byte *)(p + uVar2);
        goto LAB_0013e5c8;
      }
      if (bVar6 != key[uVar2]) goto LAB_0013e5f4;
      uVar2 = uVar2 + 1;
      lVar5 = lVar5 + -1;
    } while (1 < lVar5);
  }
  if (*pcVar3 == '\0') {
    bVar6 = *pbVar4;
    uVar2 = len;
LAB_0013e5c8:
    wVar1 = (wchar_t)uVar2;
    if (((0x3d < bVar6) || ((0x2000000100002600U >> ((ulong)bVar6 & 0x3f) & 1) == 0)) &&
       ((bVar6 != 0x5c || ((pbVar4[1] != 10 && (pbVar4[1] != 0xd)))))) {
LAB_0013e5f4:
      wVar1 = L'\0';
    }
  }
  return wVar1;
}

Assistant:

static int
bid_keycmp(const char *p, const char *key, ssize_t len)
{
	int match_len = 0;

	while (len > 0 && *p && *key) {
		if (*p == *key) {
			--len;
			++p;
			++key;
			++match_len;
			continue;
		}
		return (0);/* Not match */
	}
	if (*key != '\0')
		return (0);/* Not match */

	/* A following character should be specified characters */
	if (p[0] == '=' || p[0] == ' ' || p[0] == '\t' ||
	    p[0] == '\n' || p[0] == '\r' ||
	   (p[0] == '\\' && (p[1] == '\n' || p[1] == '\r')))
		return (match_len);
	return (0);/* Not match */
}